

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> __thiscall
cppforth::Forth::GetFileHandle(Forth *this,Cell handler,string *function,errorCodes ec)

{
  bool bVar1;
  reference pFVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Forth *this_00;
  errorCodes in_R8D;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_40;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_38;
  iterator it;
  errorCodes ec_local;
  string *function_local;
  Cell handler_local;
  Forth *this_local;
  
  this_00 = (Forth *)CONCAT44(in_register_00000034,handler);
  it._M_current._4_4_ = in_R8D;
  local_38._M_current =
       (ForthFile *)
       std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::begin
                 (&this_00->OpenFiles);
  do {
    local_40._M_current =
         (ForthFile *)
         std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::end
                   (&this_00->OpenFiles);
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                      (&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_0000000c,ec),": wrong file handler access");
      throwMessage(this_00,&local_60,it._M_current._4_4_);
      std::__cxx11::string::~string((string *)&local_60);
      uVar4 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_60);
      _Unwind_Resume(uVar4);
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
             ::operator*(&local_38);
    if (pFVar2->FILE == (Cell)function) {
      pFVar2 = __gnu_cxx::
               __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
               ::operator*(&local_38);
      std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&pFVar2->fileObject);
      uVar3 = std::fstream::is_open();
      if ((uVar3 & 1) != 0) {
        pFVar2 = __gnu_cxx::
                 __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                 ::operator*(&local_38);
        std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::shared_ptr
                  ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)this,
                   &pFVar2->fileObject);
        sVar5.
        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = extraout_RDX._M_pi;
        sVar5.
        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this;
        return (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>)
               sVar5.
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
      }
    }
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

std::shared_ptr<std::fstream> GetFileHandle(Cell handler, const std::string &function, errorCodes ec=errorAbort){
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it){
		if ((*it).FILE == handler && (*it).fileObject->is_open()){
			return (*it).fileObject;
		}
	}
	throwMessage(function + ": wrong file handler access",ec);
	throw;
}